

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

XSSimpleTypeDefinition * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,DatatypeValidator *validator,XSModel *xsModel,bool isAnySimpleType)

{
  DatatypeValidator *validator_00;
  BaseRefVectorOf<xercesc_4_0::DatatypeValidator> *this_00;
  XMLSize_t maxElems;
  bool bVar1;
  XSSimpleTypeDefinition *pXVar2;
  BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *this_01;
  DatatypeValidator *validator_01;
  XSAnnotation *headAnnot;
  XSObjectFactory *this_02;
  XMLSize_t i;
  XMLSize_t getAt;
  VARIETY local_54;
  XSSimpleTypeDefinition *local_50;
  XSSimpleTypeDefinition *local_40;
  
  pXVar2 = (XSSimpleTypeDefinition *)XSModel::getXSObject(xsModel,validator);
  if (pXVar2 != (XSSimpleTypeDefinition *)0x0) {
    return pXVar2;
  }
  validator_00 = validator->fBaseValidator;
  if (validator->fType == List) {
    if (validator_00->fType == List) {
      local_50 = addOrFind(this,validator_00,xsModel,false);
      local_40 = (XSSimpleTypeDefinition *)0x0;
      if (local_50->fVariety == VARIETY_LIST) {
        local_40 = local_50->fPrimitiveOrItemType;
      }
      local_54 = VARIETY_LIST;
LAB_002c7c05:
      this_01 = (BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)0x0;
      bVar1 = false;
      goto LAB_002c7cb4;
    }
    local_50 = (XSSimpleTypeDefinition *)
               XSModel::getTypeDefinition
                         (xsModel,(XMLCh *)SchemaSymbols::fgDT_ANYSIMPLETYPE,
                          (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    bVar1 = false;
    local_40 = addOrFind(this,validator_00,xsModel,false);
    local_54 = VARIETY_LIST;
  }
  else {
    if (validator->fType == Union) {
      this_00 = *(BaseRefVectorOf<xercesc_4_0::DatatypeValidator> **)&validator[1].fFinalSet;
      maxElems = this_00->fCurCount;
      if (maxElems == 0) {
        this_01 = (BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)0x0;
      }
      else {
        this_01 = (BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)
                  XMemory::operator_new(0x30,this->fMemoryManager);
        RefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::RefVectorOf
                  ((RefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)this_01,maxElems,false,
                   this->fMemoryManager);
        for (getAt = 0; maxElems != getAt; getAt = getAt + 1) {
          validator_01 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt(this_00,getAt);
          pXVar2 = addOrFind(this,validator_01,xsModel,false);
          BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::addElement(this_01,pXVar2);
        }
      }
      if (validator_00 == (DatatypeValidator *)0x0) {
        local_50 = (XSSimpleTypeDefinition *)
                   XSModel::getTypeDefinition
                             (xsModel,(XMLCh *)SchemaSymbols::fgDT_ANYSIMPLETYPE,
                              (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      }
      else {
        local_50 = addOrFind(this,validator_00,xsModel,false);
      }
      local_54 = VARIETY_UNION;
      bVar1 = false;
      local_40 = (XSSimpleTypeDefinition *)0x0;
      goto LAB_002c7cb4;
    }
    if (isAnySimpleType) {
      local_50 = (XSSimpleTypeDefinition *)
                 XSModel::getTypeDefinition
                           (xsModel,(XMLCh *)SchemaSymbols::fgATTVAL_ANYTYPE,
                            (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      bVar1 = false;
    }
    else {
      if (validator_00 != (DatatypeValidator *)0x0) {
        local_50 = addOrFind(this,validator_00,xsModel,false);
        local_40 = (XSSimpleTypeDefinition *)0x0;
        if (local_50->fVariety == VARIETY_ATOMIC) {
          local_40 = local_50->fPrimitiveOrItemType;
        }
        local_54 = VARIETY_ATOMIC;
        goto LAB_002c7c05;
      }
      local_50 = (XSSimpleTypeDefinition *)
                 XSModel::getTypeDefinition
                           (xsModel,(XMLCh *)SchemaSymbols::fgDT_ANYSIMPLETYPE,
                            (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      bVar1 = true;
    }
    local_54 = VARIETY_ATOMIC;
    local_40 = (XSSimpleTypeDefinition *)0x0;
  }
  this_01 = (BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)0x0;
LAB_002c7cb4:
  this_02 = (XSObjectFactory *)0x80;
  pXVar2 = (XSSimpleTypeDefinition *)XMemory::operator_new(0x80,this->fMemoryManager);
  headAnnot = getAnnotationFromModel(this_02,xsModel,validator);
  XSSimpleTypeDefinition::XSSimpleTypeDefinition
            (pXVar2,validator,local_54,&local_50->super_XSTypeDefinition,local_40,
             (XSSimpleTypeDefinitionList *)this_01,headAnnot,xsModel,this->fMemoryManager);
  putObjectInMap(this,validator,(XSObject *)pXVar2);
  if (bVar1) {
    pXVar2->fPrimitiveOrItemType = pXVar2;
  }
  processFacets(this,validator,xsModel,pXVar2);
  return pXVar2;
}

Assistant:

XSSimpleTypeDefinition*
XSObjectFactory::addOrFind(DatatypeValidator* const validator,
                           XSModel* const xsModel,
                           bool isAnySimpleType)
{
    XSSimpleTypeDefinition* xsObj = (XSSimpleTypeDefinition*) xsModel->getXSObject(validator);
    if (!xsObj)
    {
        XSTypeDefinition* baseType = 0;
        XSSimpleTypeDefinitionList* memberTypes = 0;
        XSSimpleTypeDefinition* primitiveOrItemType = 0;
        XSSimpleTypeDefinition::VARIETY typeVariety = XSSimpleTypeDefinition::VARIETY_ATOMIC;
        bool primitiveTypeSelf = false;

        //REVISIT: the getFixed method is protected so added friend XSObjectFactory
        //         to DatatypeValidator class...
        DatatypeValidator::ValidatorType dvType = validator->getType();
        DatatypeValidator* baseDV = validator->getBaseValidator();

        if (dvType == DatatypeValidator::Union)
        {
            typeVariety = XSSimpleTypeDefinition::VARIETY_UNION;
            RefVectorOf<DatatypeValidator>* membersDV = ((UnionDatatypeValidator*)validator)->getMemberTypeValidators();
            XMLSize_t size = membersDV->size();
            if (size)
            {
                memberTypes = new (fMemoryManager) RefVectorOf<XSSimpleTypeDefinition>(size, false, fMemoryManager);
                for (XMLSize_t i=0; i<size; i++)
                    memberTypes->addElement(addOrFind(membersDV->elementAt(i), xsModel));
            }

            if (baseDV)
            {
                baseType = addOrFind(baseDV, xsModel);
            }
            else
            {
                baseType = (XSSimpleTypeDefinition*) xsModel->getTypeDefinition
                (
                    SchemaSymbols::fgDT_ANYSIMPLETYPE
                    , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                );
            }
        }
        else if (dvType == DatatypeValidator::List)
        {
            typeVariety = XSSimpleTypeDefinition::VARIETY_LIST;
            if (baseDV->getType() == DatatypeValidator::List)
            {
                baseType = addOrFind(baseDV, xsModel);
                primitiveOrItemType = ((XSSimpleTypeDefinition*) baseType)->getItemType();
            }
            else
            {
                baseType = (XSSimpleTypeDefinition*) xsModel->getTypeDefinition
                (
                    SchemaSymbols::fgDT_ANYSIMPLETYPE
                    , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                );
                primitiveOrItemType = addOrFind(baseDV, xsModel);
            }
        }
        else if (!isAnySimpleType)
        {
            if (baseDV)
            {
                baseType = addOrFind(baseDV, xsModel);
                primitiveOrItemType = ((XSSimpleTypeDefinition*) baseType)->getPrimitiveType();
            }
            else // built-in
            {
                baseType = (XSSimpleTypeDefinition*) xsModel->getTypeDefinition
                (
                    SchemaSymbols::fgDT_ANYSIMPLETYPE
                    , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                );
                primitiveTypeSelf = true;
            }
        }
        else
        {
            baseType = xsModel->getTypeDefinition(SchemaSymbols::fgATTVAL_ANYTYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
        }

        xsObj = new (fMemoryManager) XSSimpleTypeDefinition
        (
            validator
            , typeVariety
            , baseType
            , primitiveOrItemType
            , memberTypes
            , getAnnotationFromModel(xsModel, validator)
            , xsModel
            , fMemoryManager
        );
        putObjectInMap(validator, xsObj);

        if (primitiveTypeSelf)
            xsObj->setPrimitiveType(xsObj);

        // process facets
        processFacets(validator, xsModel, xsObj);
    }

    return xsObj;
}